

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool testing::TestResult::ValidateTestProperty(string *xml_element,TestProperty *test_property)

{
  ostream *poVar1;
  pointer pbVar2;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var3;
  int iVar4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  ulong uVar6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  ulong uVar9;
  allocator<char> local_c1;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a0;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  string local_90;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  ostream *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,(test_property->key_)._M_dataplus._M_p,&local_c1);
  iVar4 = std::__cxx11::string::compare((char *)xml_element);
  if (iVar4 == 0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    vector<char_const*const*,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
               (char **)kReservedTestSuitesAttributes,(char **)kReservedTestSuiteAttributes,
               (allocator_type *)&local_90);
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)xml_element);
    if (iVar4 == 0) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      vector<char_const*const*,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
                 (char **)kReservedTestSuiteAttributes,(char **)kReservedTestCaseAttributes,
                 (allocator_type *)&local_90);
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)xml_element);
      if (iVar4 == 0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        vector<char_const*const*,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
                   (char **)kReservedTestCaseAttributes,(char **)kReservedOutputTestCaseAttributes,
                   (allocator_type *)&local_90);
      }
      else {
        internal::GTestLog::GTestLog
                  ((GTestLog *)&local_90,GTEST_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/oprecomp[P]flexfloat/build_O3/test/googletest-src/googletest/src/gtest.cc"
                   ,0x957);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Condition false failed. ",0x18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unrecognized xml_element provided: ",0x23);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,(xml_element->_M_dataplus)._M_p,
                   xml_element->_M_string_length);
        internal::GTestLog::~GTestLog((GTestLog *)&local_90);
        local_b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
    }
  }
  _Var5 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (local_b8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_b8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_50);
  pbVar2 = local_b8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar8 = local_b8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var5._M_current !=
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    Message::Message((Message *)&local_70);
    local_98 = local_70._M_head_impl;
    poVar1 = (ostream *)(local_70._M_head_impl + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"Reserved key used in RecordProperty(): ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_50,local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," (",2);
    local_58 = pbVar2;
    local_68 = _Var5._M_current;
    local_60 = poVar1;
    Message::Message((Message *)&local_c0);
    local_a0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         local_c0._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    if ((long)local_b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0) {
      uVar6 = (long)local_b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      poVar1 = (ostream *)
               ((long)local_c0._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl + 0x10);
      lVar7 = 8;
      uVar9 = 0;
      do {
        if (2 < uVar6 && uVar9 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
        }
        if (uVar9 == ((long)local_b8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_b8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"and ",4);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar1,*(char **)((long)local_b8.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar7 + -8),
                   *(long *)((long)&((local_b8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar7));
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'",1);
        uVar9 = uVar9 + 1;
        uVar6 = (long)local_b8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_b8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
        lVar7 = lVar7 + 0x20;
      } while (uVar9 < uVar6);
    }
    _Var3._M_head_impl = local_a0._M_head_impl;
    internal::StringStreamToString(&local_90,local_a0._M_head_impl);
    poVar1 = local_60;
    if (_Var3._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Var3._M_head_impl + 8))(_Var3._M_head_impl);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,local_90._M_dataplus._M_p,local_90._M_string_length);
    pbVar8 = local_58;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," are reserved by ",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Google Test",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
    internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/oprecomp[P]flexfloat/build_O3/test/googletest-src/googletest/src/gtest.cc"
               ,0x983,"Failed");
    _Var5._M_current = local_68;
    internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)&local_70);
    internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (local_98 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return _Var5._M_current == pbVar8;
}

Assistant:

bool TestResult::ValidateTestProperty(const std::string& xml_element,
                                      const TestProperty& test_property) {
  return ValidateTestPropertyName(test_property.key(),
                                  GetReservedAttributesForElement(xml_element));
}